

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.hpp
# Opt level: O1

RESOURCE_STATE __thiscall
Diligent::RenderPassBase<Diligent::EngineVkImplTraits>::GetAttachmentState
          (RenderPassBase<Diligent::EngineVkImplTraits> *this,Uint32 Subpass,Uint32 Attachment)

{
  char (*in_RCX) [42];
  string msg;
  string local_40;
  
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      ).m_Desc.AttachmentCount <= Attachment) {
    FormatString<char[26],char[42]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attachment < this->m_Desc.AttachmentCount",in_RCX);
    in_RCX = (char (*) [42])0x88;
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetAttachmentState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      ).m_Desc.SubpassCount <= Subpass) {
    FormatString<char[26],char[36]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Subpass < this->m_Desc.SubpassCount",(char (*) [36])in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"GetAttachmentState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderPassBase.hpp"
               ,0x89);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return this->m_AttachmentStates
         [Subpass * (this->
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    ).m_Desc.AttachmentCount + Attachment];
}

Assistant:

RESOURCE_STATE GetAttachmentState(Uint32 Subpass, Uint32 Attachment) const
    {
        VERIFY_EXPR(Attachment < this->m_Desc.AttachmentCount);
        VERIFY_EXPR(Subpass < this->m_Desc.SubpassCount);
        return m_AttachmentStates[this->m_Desc.AttachmentCount * Subpass + Attachment];
    }